

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

int __thiscall Lodtalk::StackInterpreterProxy::returnFloat(StackInterpreterProxy *this,double value)

{
  StackInterpreter *pSVar1;
  StackMemory *pSVar2;
  uint8_t *puVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar5;
  
  pSVar1 = this->interpreter;
  aVar5 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::floatObjectFor(pSVar1->context,value);
  pSVar2 = pSVar1->stack;
  puVar3 = (pSVar2->stackFrame).stackPointer;
  (pSVar2->stackFrame).stackPointer = puVar3 + -8;
  *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar3 + -8) = aVar5;
  pSVar1 = this->interpreter;
  pSVar2 = pSVar1->stack;
  paVar4 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(pSVar2->stackFrame).stackPointer;
  aVar5 = *paVar4;
  (pSVar2->stackFrame).stackPointer = (uint8_t *)(paVar4 + 1);
  StackInterpreter::returnValue(pSVar1,(Oop)aVar5);
  return 0;
}

Assistant:

int StackInterpreterProxy::returnFloat(double value)
{
    interpreter->pushFloatObject(value);
    interpreter->returnTop();
    return 0;
}